

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_mem.h
# Opt level: O0

object_task<lzham::search_accelerator> * __thiscall
lzham::
lzham_new<lzham::object_task<lzham::search_accelerator>,lzham::search_accelerator*,void(lzham::search_accelerator::*)(unsigned_long_long,void*),lzham::object_task_flags>
          (search_accelerator **init0,offset_in_search_accelerator_to_subr *init1,
          object_task_flags *init2)

{
  object_task<lzham::search_accelerator> *in_RDX;
  object_method_ptr *in_RSI;
  object_task<lzham::search_accelerator> *p;
  size_t *in_stack_ffffffffffffffc0;
  size_t in_stack_ffffffffffffffc8;
  undefined8 local_8;
  
  local_8 = (search_accelerator *)lzham_malloc(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  if (local_8 == (search_accelerator *)0x0) {
    local_8 = (search_accelerator *)0x0;
  }
  else {
    object_task<lzham::search_accelerator>::object_task
              (in_RDX,local_8,*in_RSI,(uint)((ulong)local_8 >> 0x20));
  }
  return (object_task<lzham::search_accelerator> *)local_8;
}

Assistant:

inline T* lzham_new(const A& init0, const B& init1, const C& init2)
   {
      T* p = static_cast<T*>(lzham_malloc(sizeof(T)));
      if (!p) return NULL;
      return new (static_cast<void*>(p)) T(init0, init1, init2); 
   }